

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool print_number(cJSON *item,printbuffer *output_buffer)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  lconv *plVar4;
  uchar *puVar5;
  cJSON_bool cVar6;
  ulong uVar7;
  uchar uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  double dVar10;
  double test;
  uchar number_buffer [26];
  double local_50;
  undefined8 local_48;
  undefined2 uStack_40;
  undefined6 local_3e;
  undefined2 uStack_38;
  undefined8 uStack_36;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_38 = 0;
  uStack_36 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_3e = 0;
  plVar4 = localeconv();
  uVar1 = *plVar4->decimal_point;
  local_50 = 0.0;
  cVar6 = 0;
  if (item == (cJSON *)0x0) goto LAB_0010616e;
  if ((ulong)ABS(in_XMM0_Qa) < 0x7ff0000000000000) {
    uVar2 = sprintf((char *)&local_48,"%1.15g");
    iVar3 = __isoc99_sscanf(&local_48,"%lg",&local_50);
    if (iVar3 == 1) {
      dVar10 = ABS(local_50);
      if (ABS(local_50) <= ABS(in_XMM0_Qa)) {
        dVar10 = ABS(in_XMM0_Qa);
      }
      if (dVar10 * 2.220446049250313e-16 < ABS(local_50 - in_XMM0_Qa)) goto LAB_00106108;
    }
    else {
LAB_00106108:
      uVar2 = sprintf((char *)&local_48,"%1.17g");
    }
    cVar6 = 0;
    if (0x19 < uVar2) goto LAB_0010616e;
  }
  else {
    uVar9 = (ulong)local_48 >> 0x20;
    local_48 = CONCAT44((uint)uVar9 & 0xffffff00,0x6c6c756e);
    uVar2 = 4;
  }
  uVar9 = (ulong)uVar2;
  puVar5 = ensure((printbuffer *)item,uVar9 + 1);
  cVar6 = 0;
  if (puVar5 != (uchar *)0x0) {
    if (uVar9 != 0) {
      uVar7 = 0;
      do {
        uVar8 = *(uchar *)((long)&local_48 + uVar7);
        if (*(uchar *)((long)&local_48 + uVar7) == uVar1) {
          uVar8 = '.';
        }
        puVar5[uVar7] = uVar8;
        uVar7 = uVar7 + 1;
      } while (uVar9 != uVar7);
    }
    puVar5[uVar9] = '\0';
    item->child = (cJSON *)((long)&item->child->next + uVar9);
    cVar6 = 1;
  }
LAB_0010616e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return cVar6;
  }
  __stack_chk_fail();
}

Assistant:

static cJSON_bool print_number(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output_pointer = NULL;
    double d = item->valuedouble;
    int length = 0;
    size_t i = 0;
    unsigned char number_buffer[26] = {0}; /* temporary buffer to print the number into */
    unsigned char decimal_point = get_decimal_point();
    double test = 0.0;

    if (output_buffer == NULL)
    {
        return false;
    }

    /* This checks for NaN and Infinity */
    if (isnan(d) || isinf(d))
    {
        length = sprintf((char*)number_buffer, "null");
    }
    else
    {
        /* Try 15 decimal places of precision to avoid nonsignificant nonzero digits */
        length = sprintf((char*)number_buffer, "%1.15g", d);

        /* Check whether the original double can be recovered */
        if ((sscanf((char*)number_buffer, "%lg", &test) != 1) || !compare_double((double)test, d))
        {
            /* If not, print with 17 decimal places of precision */
            length = sprintf((char*)number_buffer, "%1.17g", d);
        }
    }

    /* sprintf failed or buffer overrun occurred */
    if ((length < 0) || (length > (int)(sizeof(number_buffer) - 1)))
    {
        return false;
    }

    /* reserve appropriate space in the output */
    output_pointer = ensure(output_buffer, (size_t)length + sizeof(""));
    if (output_pointer == NULL)
    {
        return false;
    }

    /* copy the printed number to the output and replace locale
     * dependent decimal point with '.' */
    for (i = 0; i < ((size_t)length); i++)
    {
        if (number_buffer[i] == decimal_point)
        {
            output_pointer[i] = '.';
            continue;
        }

        output_pointer[i] = number_buffer[i];
    }
    output_pointer[i] = '\0';

    output_buffer->offset += (size_t)length;

    return true;
}